

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::AddKel
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  int64_t iVar2;
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *in_RDI;
  TPZEqnArray<double> AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  TPZEqnArray<double> *in_stack_ffffffffffffcd20;
  TPZEqnArray<double> *in_stack_ffffffffffffcd28;
  TPZEqnArray<double> *in_stack_ffffffffffffcd38;
  TPZFileEqnStorage<double> *in_stack_ffffffffffffcd40;
  TPZVec<long> *in_stack_ffffffffffffcd48;
  TPZEqnArray<double> *in_stack_ffffffffffffcd50;
  TPZFMatrix<double> *in_stack_ffffffffffffcd58;
  TPZFrontNonSym<double> *in_stack_ffffffffffffcd60;
  TPZEqnArray<double> *local_28;
  long local_20;
  
  TPZFrontNonSym<double>::AddKel
            (in_stack_ffffffffffffcd60,in_stack_ffffffffffffcd58,
             (TPZVec<long> *)in_stack_ffffffffffffcd50);
  EquationsToDecompose
            ((TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *)
             in_stack_ffffffffffffcd50,in_stack_ffffffffffffcd48,
             (int64_t *)in_stack_ffffffffffffcd40,(int64_t *)in_stack_ffffffffffffcd38);
  TPZEqnArray<double>::TPZEqnArray(in_stack_ffffffffffffcd50);
  if (local_20 <= (long)local_28) {
    TPZFrontNonSym<double>::DecomposeEquations
              ((TPZFrontNonSym<double> *)in_stack_ffffffffffffcd40,
               (int64_t)in_stack_ffffffffffffcd38,(int64_t)in_RDI,in_stack_ffffffffffffcd28);
    CheckCompress(in_RDI);
    TPZFileEqnStorage<double>::AddEqnArray(in_stack_ffffffffffffcd40,in_stack_ffffffffffffcd38);
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    in_stack_ffffffffffffcd20 = local_28;
    if (local_28 == (TPZEqnArray<double> *)(iVar2 + -1)) {
      TPZFileEqnStorage<double>::FinishWriting((TPZFileEqnStorage<double> *)local_28);
      TPZFileEqnStorage<double>::ReOpen((TPZFileEqnStorage<double> *)local_28);
      in_stack_ffffffffffffcd20 = local_28;
    }
  }
  DVar1 = TPZFront<double>::GetDecomposeType(&(in_RDI->fFront).super_TPZFront<double>);
  (in_RDI->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDecomposed = (char)DVar1;
  TPZEqnArray<double>::~TPZEqnArray(in_stack_ffffffffffffcd20);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex){
	
	// message #1.3 to fFront:TPZFront
	fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.NElements();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	int64_t mineq, maxeq;
	
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}